

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::SplitNDLayerParams::SerializeWithCachedSizes
          (SplitNDLayerParams *this,CodedOutputStream *output)

{
  uint64 value;
  int index;
  int iVar1;
  
  if (this->axis_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt64(1,this->axis_,output);
  }
  if (this->numsplits_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt64(2,this->numsplits_,output);
  }
  iVar1 = (this->splitsizes_).current_size_;
  if (0 < iVar1) {
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,0x1a);
    google::protobuf::io::CodedOutputStream::WriteVarint32
              (output,this->_splitsizes_cached_byte_size_);
    iVar1 = (this->splitsizes_).current_size_;
  }
  index = 0;
  if (iVar1 < 1) {
    iVar1 = 0;
    index = 0;
  }
  for (; iVar1 != index; index = index + 1) {
    value = splitsizes(this,index);
    google::protobuf::io::CodedOutputStream::WriteVarint64(output,value);
  }
  return;
}

Assistant:

void SplitNDLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.SplitNDLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // int64 axis = 1;
  if (this->axis() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(1, this->axis(), output);
  }

  // uint64 numSplits = 2;
  if (this->numsplits() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(2, this->numsplits(), output);
  }

  // repeated uint64 splitSizes = 3;
  if (this->splitsizes_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(3, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_splitsizes_cached_byte_size_);
  }
  for (int i = 0, n = this->splitsizes_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(
      this->splitsizes(i), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.SplitNDLayerParams)
}